

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O0

BOOL empty_set(List *set,int literal_bits_mask,int literal_bits)

{
  BOOL BVar1;
  uint local_24;
  int i;
  int literal_bits_local;
  int literal_bits_mask_local;
  List *set_local;
  
  local_24 = 0;
  while( true ) {
    if (0xffff < (int)local_24) {
      return TRUE;
    }
    if (((local_24 & literal_bits_mask) == literal_bits) &&
       (BVar1 = is_member_of_set((unsigned_short)local_24,set), BVar1 != FALSE)) break;
    local_24 = local_24 + 1;
  }
  return FALSE;
}

Assistant:

BOOL
empty_set (List *set, int literal_bits_mask, int literal_bits)
{
  int i;

  for (i = 0; i < 65536; i++)
    if ((i & literal_bits_mask) == literal_bits && is_member_of_set (i, set))
      return FALSE;
  return TRUE;
}